

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O3

void __thiscall HttpHeaderBase::buildHeader(HttpHeaderBase *this)

{
  string *psVar1;
  FieldType FVar2;
  int iVar3;
  long lVar4;
  Node *pNVar5;
  long lVar6;
  
  iVar3 = (*this->_vptr_HttpHeaderBase[4])();
  if (iVar3 < 1) {
    (this->mHeaderStr)._M_string_length = 0;
    *(this->mHeaderStr)._M_dataplus._M_p = '\0';
    return;
  }
  if (0 < this->mNumFields) {
    psVar1 = &this->mHeaderStr;
    lVar6 = 0;
    do {
      FVar2 = this->mFields[lVar6].mType;
      pNVar5 = (this->mFieldMappings).mHead;
      do {
        pNVar5 = pNVar5->next;
        if (pNVar5 == (this->mFieldMappings).mTail) break;
        lVar4 = (**(code **)(*(long *)pNVar5->val + 0x18))(pNVar5->val,FVar2);
      } while (lVar4 == 0);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((char *)psVar1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->mNumFields);
  }
  std::__cxx11::string::append((char *)&this->mHeaderStr);
  return;
}

Assistant:

void HttpHeaderBase::buildHeader() const
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (buildFirstLine() <= 0)
	{
		mHeaderStr.clear();
		return;
	}
	
	for (int i = 0; i < mNumFields; i++)
	{
		mHeaderStr += getFieldTypeString(mFields[i].mType);
		mHeaderStr += ": ";
		mHeaderStr += mFields[i].mData;
		mHeaderStr += "\r\n";
	}
		mHeaderStr += "\r\n";	
}